

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Mapper2_write_and_read_byte_ppu_bus_Test::TestBody
          (Mapper2_write_and_read_byte_ppu_bus_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  pointer pIVar4;
  char *message;
  Mapper in_R8D;
  AssertHelper local_1f8;
  Message local_1f0;
  uchar local_1e5;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> rom;
  stringstream local_1b8 [8];
  stringstream ss;
  undefined1 local_30 [8];
  string bytes;
  Mapper2_write_and_read_byte_ppu_bus_Test *this_local;
  
  bytes.field_2._8_8_ = this;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_30,(_anonymous_namespace_ *)0x1,'\x01','\x02',in_R8D);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_30,_Var2);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&gtest_ar.message_,(istream *)local_1b8);
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  (*pIVar4->_vptr_IRom[7])(pIVar4,0x100,0x89);
  local_1e4 = 0x89;
  pIVar4 = std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::operator->
                     ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
                      &gtest_ar.message_);
  iVar3 = (*pIVar4->_vptr_IRom[6])(pIVar4,0x100);
  local_1e5 = (uchar)iVar3;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_1e0,"0x89","rom->ppu_read_byte(0x0100)",&local_1e4,&local_1e5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x113,message);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)
             &gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Mapper2, write_and_read_byte_ppu_bus) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Mapper2)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    rom->ppu_write_byte(0x0100, 0x89);
    EXPECT_EQ(0x89, rom->ppu_read_byte(0x0100));
}